

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall cmLocalGenerator::GenerateInstallRules(cmLocalGenerator *this)

{
  string *config_00;
  __type _Var1;
  bool bVar2;
  char *pcVar3;
  reference pbVar4;
  ulong uVar5;
  reference pvVar6;
  cmState *this_00;
  ostream *poVar7;
  void *pvVar8;
  reference ppcVar9;
  reference ppcVar10;
  cmMakefile *pcVar11;
  byte local_4c9;
  allocator local_481;
  undefined1 local_480 [8];
  string odir;
  string local_458;
  __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  local_438;
  __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  local_430;
  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  local_428;
  const_iterator ci;
  __normal_iterator<cmInstallGenerator_*const_*,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
  local_418;
  const_iterator gi;
  vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *installers;
  string local_400;
  char *local_3e0;
  char *so_no_exe;
  cmGeneratedFileStream fout;
  int toplevel_install;
  string homedir;
  undefined1 local_160 [8];
  string file;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_120;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_118;
  iterator i;
  char **c;
  char *default_order [5];
  string default_config;
  string *config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  string local_78;
  char *local_58;
  char *stagingPrefix;
  allocator local_39;
  string local_38;
  char *local_18;
  char *prefix;
  cmLocalGenerator *this_local;
  
  pcVar11 = this->Makefile;
  prefix = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"CMAKE_INSTALL_PREFIX",&local_39);
  pcVar3 = cmMakefile::GetDefinition(pcVar11,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = pcVar3;
  if (pcVar3 == (char *)0x0) {
    local_18 = "/usr/local";
  }
  pcVar11 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_78,"CMAKE_STAGING_PREFIX",
             (allocator *)
             ((long)&configurationTypes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pcVar3 = cmMakefile::GetDefinition(pcVar11,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&configurationTypes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  if (pcVar3 != (char *)0x0) {
    local_18 = pcVar3;
  }
  local_58 = pcVar3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&config);
  cmMakefile::GetConfigurations
            ((string *)((long)&default_config.field_2 + 8),this->Makefile,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&config,false);
  config_00 = (string *)(default_config.field_2._M_local_buf + 8);
  std::__cxx11::string::string((string *)(default_order + 4),(string *)config_00);
  memcpy(&c,&PTR_anon_var_dwarf_1a8cf0_00af22d0,0x28);
  i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c;
  while( true ) {
    local_4c9 = 0;
    if (*(long *)i._M_current != 0) {
      local_4c9 = std::__cxx11::string::empty();
    }
    if ((local_4c9 & 1) == 0) break;
    local_118._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&config);
    while( true ) {
      local_120._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&config);
      bVar2 = __gnu_cxx::operator!=(&local_118,&local_120);
      if (!bVar2) break;
      pbVar4 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_118);
      cmsys::SystemTools::UpperCase((string *)((long)&file.field_2 + 8),pbVar4);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&file.field_2 + 8),*(char **)i._M_current);
      std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
      if (bVar2) {
        pbVar4 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_118);
        std::__cxx11::string::operator=((string *)(default_order + 4),(string *)pbVar4);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_118);
    }
    i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(i._M_current)->_M_string_length;
  }
  uVar5 = std::__cxx11::string::empty();
  if (((uVar5 & 1) != 0) &&
     (bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&config), !bVar2)) {
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&config,0);
    std::__cxx11::string::operator=((string *)(default_order + 4),(string *)pvVar6);
  }
  pcVar3 = cmState::Snapshot::GetCurrentBinaryDirectory(&this->StateSnapshot);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_160,pcVar3,(allocator *)(homedir.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(homedir.field_2._M_local_buf + 0xf));
  this_00 = GetState(this);
  pcVar3 = cmState::GetBinaryDirectory(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&toplevel_install,pcVar3,(allocator *)&fout.field_0x247);
  std::allocator<char>::~allocator((allocator<char> *)&fout.field_0x247);
  fout._576_4_ = 0;
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_160,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &toplevel_install);
  if (_Var1) {
    fout._576_4_ = 1;
  }
  std::__cxx11::string::operator+=((string *)local_160,"/cmake_install.cmake");
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&so_no_exe,pcVar3,false);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)&so_no_exe,true);
  poVar7 = std::operator<<((ostream *)&so_no_exe,"# Install script for directory: ");
  pcVar3 = cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
  poVar7 = std::operator<<(poVar7,pcVar3);
  pvVar8 = (void *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<((ostream *)&so_no_exe,"# Set the install prefix");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<(poVar7,"if(NOT DEFINED CMAKE_INSTALL_PREFIX)");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<(poVar7,"  set(CMAKE_INSTALL_PREFIX \"");
  poVar7 = std::operator<<(poVar7,local_18);
  poVar7 = std::operator<<(poVar7,"\")");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<(poVar7,"endif()");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<(poVar7,"string(REGEX REPLACE \"/$\" \"\" CMAKE_INSTALL_PREFIX ");
  poVar7 = std::operator<<(poVar7,"\"${CMAKE_INSTALL_PREFIX}\")");
  pvVar8 = (void *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
  poVar7 = std::operator<<((ostream *)&so_no_exe,
                           "# Set the install configuration name.\nif(NOT DEFINED CMAKE_INSTALL_CONFIG_NAME)\n  if(BUILD_TYPE)\n    string(REGEX REPLACE \"^[^A-Za-z0-9_]+\" \"\"\n           CMAKE_INSTALL_CONFIG_NAME \"${BUILD_TYPE}\")\n  else()\n    set(CMAKE_INSTALL_CONFIG_NAME \""
                          );
  poVar7 = std::operator<<(poVar7,(string *)(default_order + 4));
  std::operator<<(poVar7,
                  "\")\n  endif()\n  message(STATUS \"Install configuration: \\\"${CMAKE_INSTALL_CONFIG_NAME}\\\"\")\nendif()\n\n"
                 );
  std::operator<<((ostream *)&so_no_exe,
                  "# Set the component getting installed.\nif(NOT CMAKE_INSTALL_COMPONENT)\n  if(COMPONENT)\n    message(STATUS \"Install component: \\\"${COMPONENT}\\\"\")\n    set(CMAKE_INSTALL_COMPONENT \"${COMPONENT}\")\n  else()\n    set(CMAKE_INSTALL_COMPONENT)\n  endif()\nendif()\n\n"
                 );
  pcVar11 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_400,"CMAKE_INSTALL_SO_NO_EXE",(allocator *)((long)&installers + 7));
  pcVar3 = cmMakefile::GetDefinition(pcVar11,&local_400);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator((allocator<char> *)((long)&installers + 7));
  local_3e0 = pcVar3;
  if (pcVar3 != (char *)0x0) {
    poVar7 = std::operator<<((ostream *)&so_no_exe,
                             "# Install shared libraries without execute permission?\nif(NOT DEFINED CMAKE_INSTALL_SO_NO_EXE)\n  set(CMAKE_INSTALL_SO_NO_EXE \""
                            );
    poVar7 = std::operator<<(poVar7,local_3e0);
    std::operator<<(poVar7,"\")\nendif()\n\n");
  }
  gi._M_current = (cmInstallGenerator **)cmMakefile::GetInstallGenerators(this->Makefile);
  local_418._M_current =
       (cmInstallGenerator **)
       std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::begin
                 ((vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *)
                  gi._M_current);
  while( true ) {
    ci._M_current =
         (cmLocalGenerator **)
         std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::end
                   ((vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *)
                    gi._M_current);
    bVar2 = __gnu_cxx::operator!=
                      (&local_418,
                       (__normal_iterator<cmInstallGenerator_*const_*,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
                        *)&ci);
    if (!bVar2) break;
    ppcVar9 = __gnu_cxx::
              __normal_iterator<cmInstallGenerator_*const_*,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
              ::operator*(&local_418);
    cmScriptGenerator::Generate
              (&(*ppcVar9)->super_cmScriptGenerator,(ostream *)&so_no_exe,config_00,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&config);
    __gnu_cxx::
    __normal_iterator<cmInstallGenerator_*const_*,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
    ::operator++(&local_418);
  }
  GenerateTargetInstallRules
            (this,(ostream *)&so_no_exe,config_00,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&config);
  bVar2 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::empty
                    (&this->Children);
  if (!bVar2) {
    std::operator<<((ostream *)&so_no_exe,"if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n");
    std::operator<<((ostream *)&so_no_exe,"  # Include the install script for each subdirectory.\n")
    ;
    local_430._M_current =
         (cmLocalGenerator **)
         std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin
                   (&this->Children);
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator*const*,std::vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>>>
    ::__normal_iterator<cmLocalGenerator**>
              ((__normal_iterator<cmLocalGenerator*const*,std::vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>>>
                *)&local_428,&local_430);
    while( true ) {
      local_438._M_current =
           (cmLocalGenerator **)
           std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end
                     (&this->Children);
      bVar2 = __gnu_cxx::operator!=(&local_428,&local_438);
      if (!bVar2) break;
      ppcVar10 = __gnu_cxx::
                 __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                 ::operator*(&local_428);
      pcVar11 = GetMakefile(*ppcVar10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_458,"EXCLUDE_FROM_ALL",
                 (allocator *)(odir.field_2._M_local_buf + 0xf));
      bVar2 = cmMakefile::GetPropertyAsBool(pcVar11,&local_458);
      std::__cxx11::string::~string((string *)&local_458);
      std::allocator<char>::~allocator((allocator<char> *)(odir.field_2._M_local_buf + 0xf));
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        ppcVar10 = __gnu_cxx::
                   __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                   ::operator*(&local_428);
        pcVar11 = GetMakefile(*ppcVar10);
        pcVar3 = cmMakefile::GetCurrentBinaryDirectory(pcVar11);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_480,pcVar3,&local_481);
        std::allocator<char>::~allocator((allocator<char> *)&local_481);
        cmsys::SystemTools::ConvertToUnixSlashes((string *)local_480);
        poVar7 = std::operator<<((ostream *)&so_no_exe,"  include(\"");
        poVar7 = std::operator<<(poVar7,(string *)local_480);
        poVar7 = std::operator<<(poVar7,"/cmake_install.cmake\")");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)local_480);
      }
      __gnu_cxx::
      __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
      ::operator++(&local_428);
    }
    std::operator<<((ostream *)&so_no_exe,"\n");
    std::operator<<((ostream *)&so_no_exe,"endif()\n\n");
  }
  if (fout._576_4_ != 0) {
    poVar7 = std::operator<<((ostream *)&so_no_exe,
                             "if(CMAKE_INSTALL_COMPONENT)\n  set(CMAKE_INSTALL_MANIFEST \"install_manifest_${CMAKE_INSTALL_COMPONENT}.txt\")\nelse()\n  set(CMAKE_INSTALL_MANIFEST \"install_manifest.txt\")\nendif()\n\nstring(REPLACE \";\" \"\\n\" CMAKE_INSTALL_MANIFEST_CONTENT\n       \"${CMAKE_INSTALL_MANIFEST_FILES}\")\nfile(WRITE \""
                            );
    poVar7 = std::operator<<(poVar7,(string *)&toplevel_install);
    std::operator<<(poVar7,
                    "/${CMAKE_INSTALL_MANIFEST}\"\n     \"${CMAKE_INSTALL_MANIFEST_CONTENT}\")\n");
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&so_no_exe);
  std::__cxx11::string::~string((string *)&toplevel_install);
  std::__cxx11::string::~string((string *)local_160);
  std::__cxx11::string::~string((string *)(default_order + 4));
  std::__cxx11::string::~string((string *)(default_config.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&config);
  return;
}

Assistant:

void cmLocalGenerator::GenerateInstallRules()
{
  // Compute the install prefix.
  const char* prefix = this->Makefile->GetDefinition("CMAKE_INSTALL_PREFIX");
#if defined(_WIN32) && !defined(__CYGWIN__)
  std::string prefix_win32;
  if(!prefix)
    {
    if(!cmSystemTools::GetEnv("SystemDrive", prefix_win32))
      {
      prefix_win32 = "C:";
      }
    const char* project_name = this->Makefile->GetDefinition("PROJECT_NAME");
    if(project_name && project_name[0])
      {
      prefix_win32 += "/Program Files/";
      prefix_win32 += project_name;
      }
    else
      {
      prefix_win32 += "/InstalledCMakeProject";
      }
    prefix = prefix_win32.c_str();
    }
#elif defined(__HAIKU__)
  char dir[B_PATH_NAME_LENGTH];
  if (!prefix)
    {
    if (find_directory(B_SYSTEM_DIRECTORY, -1, false, dir, sizeof(dir))
        == B_OK)
      {
      prefix = dir;
      }
    else
      {
      prefix = "/boot/system";
      }
    }
#else
  if (!prefix)
    {
    prefix = "/usr/local";
    }
#endif
  if (const char *stagingPrefix
                  = this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX"))
    {
    prefix = stagingPrefix;
    }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes;
  const std::string& config =
    this->Makefile->GetConfigurations(configurationTypes, false);

  // Choose a default install configuration.
  std::string default_config = config;
  const char* default_order[] = {"RELEASE", "MINSIZEREL",
                                 "RELWITHDEBINFO", "DEBUG", 0};
  for(const char** c = default_order; *c && default_config.empty(); ++c)
    {
    for(std::vector<std::string>::iterator i = configurationTypes.begin();
        i != configurationTypes.end(); ++i)
      {
      if(cmSystemTools::UpperCase(*i) == *c)
        {
        default_config = *i;
        }
      }
    }
  if(default_config.empty() && !configurationTypes.empty())
    {
    default_config = configurationTypes[0];
    }

  // Create the install script file.
  std::string file = this->StateSnapshot.GetCurrentBinaryDirectory();
  std::string homedir = this->GetState()->GetBinaryDirectory();
  int toplevel_install = 0;
  if (file == homedir)
    {
    toplevel_install = 1;
    }
  file += "/cmake_install.cmake";
  cmGeneratedFileStream fout(file.c_str());
  fout.SetCopyIfDifferent(true);

  // Write the header.
  fout << "# Install script for directory: "
       << this->StateSnapshot.GetCurrentSourceDirectory()
       << std::endl << std::endl;
  fout << "# Set the install prefix" << std::endl
       << "if(NOT DEFINED CMAKE_INSTALL_PREFIX)" << std::endl
       << "  set(CMAKE_INSTALL_PREFIX \"" << prefix << "\")" << std::endl
       << "endif()" << std::endl
       << "string(REGEX REPLACE \"/$\" \"\" CMAKE_INSTALL_PREFIX "
       << "\"${CMAKE_INSTALL_PREFIX}\")" << std::endl
       << std::endl;

  // Write support code for generating per-configuration install rules.
  fout <<
    "# Set the install configuration name.\n"
    "if(NOT DEFINED CMAKE_INSTALL_CONFIG_NAME)\n"
    "  if(BUILD_TYPE)\n"
    "    string(REGEX REPLACE \"^[^A-Za-z0-9_]+\" \"\"\n"
    "           CMAKE_INSTALL_CONFIG_NAME \"${BUILD_TYPE}\")\n"
    "  else()\n"
    "    set(CMAKE_INSTALL_CONFIG_NAME \"" << default_config << "\")\n"
    "  endif()\n"
    "  message(STATUS \"Install configuration: "
    "\\\"${CMAKE_INSTALL_CONFIG_NAME}\\\"\")\n"
    "endif()\n"
    "\n";

  // Write support code for dealing with component-specific installs.
  fout <<
    "# Set the component getting installed.\n"
    "if(NOT CMAKE_INSTALL_COMPONENT)\n"
    "  if(COMPONENT)\n"
    "    message(STATUS \"Install component: \\\"${COMPONENT}\\\"\")\n"
    "    set(CMAKE_INSTALL_COMPONENT \"${COMPONENT}\")\n"
    "  else()\n"
    "    set(CMAKE_INSTALL_COMPONENT)\n"
    "  endif()\n"
    "endif()\n"
    "\n";

  // Copy user-specified install options to the install code.
  if(const char* so_no_exe =
     this->Makefile->GetDefinition("CMAKE_INSTALL_SO_NO_EXE"))
    {
    fout <<
      "# Install shared libraries without execute permission?\n"
      "if(NOT DEFINED CMAKE_INSTALL_SO_NO_EXE)\n"
      "  set(CMAKE_INSTALL_SO_NO_EXE \"" << so_no_exe << "\")\n"
      "endif()\n"
      "\n";
    }

  // Ask each install generator to write its code.
  std::vector<cmInstallGenerator*> const& installers =
    this->Makefile->GetInstallGenerators();
  for(std::vector<cmInstallGenerator*>::const_iterator
        gi = installers.begin();
      gi != installers.end(); ++gi)
    {
    (*gi)->Generate(fout, config, configurationTypes);
    }

  // Write rules from old-style specification stored in targets.
  this->GenerateTargetInstallRules(fout, config, configurationTypes);

  // Include install scripts from subdirectories.
  if(!this->Children.empty())
    {
    fout << "if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n";
    fout << "  # Include the install script for each subdirectory.\n";
    for(std::vector<cmLocalGenerator*>::const_iterator
          ci = this->Children.begin(); ci != this->Children.end(); ++ci)
      {
      if(!(*ci)->GetMakefile()->GetPropertyAsBool("EXCLUDE_FROM_ALL"))
        {
        std::string odir = (*ci)->GetMakefile()->GetCurrentBinaryDirectory();
        cmSystemTools::ConvertToUnixSlashes(odir);
        fout << "  include(\"" <<  odir
             << "/cmake_install.cmake\")" << std::endl;
        }
      }
    fout << "\n";
    fout << "endif()\n\n";
    }

  // Record the install manifest.
  if ( toplevel_install )
    {
    fout <<
      "if(CMAKE_INSTALL_COMPONENT)\n"
      "  set(CMAKE_INSTALL_MANIFEST \"install_manifest_"
      "${CMAKE_INSTALL_COMPONENT}.txt\")\n"
      "else()\n"
      "  set(CMAKE_INSTALL_MANIFEST \"install_manifest.txt\")\n"
      "endif()\n"
      "\n"
      "string(REPLACE \";\" \"\\n\" CMAKE_INSTALL_MANIFEST_CONTENT\n"
      "       \"${CMAKE_INSTALL_MANIFEST_FILES}\")\n"
      "file(WRITE \"" << homedir << "/${CMAKE_INSTALL_MANIFEST}\"\n"
      "     \"${CMAKE_INSTALL_MANIFEST_CONTENT}\")\n";
    }
}